

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::File
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,path *param_2,
          Header *param_3)

{
  long lVar1;
  
  File(this,param_2,_S_out|_S_in|_S_app);
  std::ostream::seekp((long)&this->field_0x38,_S_beg);
  check_stream(this,"seekp to end");
  lVar1 = std::ostream::tellp();
  if (lVar1 == 0) {
    write_preamble(this,param_3);
  }
  else {
    std::istream::seekg(&this->stream_,0,0);
    check_stream(this,"seekg to begin");
    read_preamble(this);
  }
  check_size(this);
  return;
}

Assistant:

File(FileOpenTag::ReadWrite, const std::filesystem::path& filename, const HeaderType& header)
    : File(filename, std::ios_base::in | std::ios_base::out | std::ios_base::app)
    {
        // We need to use append mode otherwise it won't use O_CREAT.
        // Meanwhile app doesn't event seek to the end... oh my.
        stream_.seekp(0, std::fstream::end);
        check_stream("seekp to end");
        if (stream_.tellp() == 0)
        {
            write_preamble(header);
        }
        else
        {
            stream_.seekg(0);
            check_stream("seekg to begin");
            read_preamble();
            // TODO check compatibility of headers.
        }
        check_size();
    }